

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O0

void void_pthread_rwlock_wrlock(void *mu)

{
  void *mu_local;
  
  nsync_pthread_rwlock_wrlock_((nsync_pthread_rwlock_ *)mu);
  return;
}

Assistant:

static void void_pthread_rwlock_wrlock (void *mu) {
	pthread_rwlock_wrlock ((pthread_rwlock_t *) mu);
}